

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_view.hpp
# Opt level: O0

data_view * __thiscall protozero::data_view::to_string_abi_cxx11_(data_view *this)

{
  char *pcVar1;
  ulong uVar2;
  assert_error *this_00;
  long *in_RSI;
  allocator local_25 [21];
  data_view *this_local;
  
  this_local = this;
  if (*in_RSI == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
  }
  pcVar1 = (char *)*in_RSI;
  uVar2 = in_RSI[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,uVar2,local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  return this;
}

Assistant:

std::string to_string() const {
        protozero_assert(m_data);
        return {m_data, m_size};
    }